

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

void * drmp3_malloc(size_t sz,drmp3_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  
  if (pAllocationCallbacks == (drmp3_allocation_callbacks *)0x0) {
    pvVar1 = (*SDL20_malloc)(sz);
    return pvVar1;
  }
  if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
    pvVar1 = (*pAllocationCallbacks->onMalloc)(sz,pAllocationCallbacks->pUserData);
    return pvVar1;
  }
  if (pAllocationCallbacks->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
    pvVar1 = (*pAllocationCallbacks->onRealloc)((void *)0x0,sz,pAllocationCallbacks->pUserData);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

DRMP3_API void* drmp3_malloc(size_t sz, const drmp3_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        return drmp3__malloc_from_callbacks(sz, pAllocationCallbacks);
    } else {
        return drmp3__malloc_default(sz, NULL);
    }
}